

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckFunctions.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  string *this_00;
  byte __lhs;
  size_type sVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  string *psVar11;
  string functionName;
  Error error;
  string functionLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  string local_280;
  RegularExpression regex;
  
  if (regEx != (char *)0x0) {
    this->m_TestsDone[0x1e] = true;
    std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x1e));
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x1e));
  }
  if (maxLength != 0) {
    this->m_TestsDone[0x1f] = true;
    psVar11 = this->m_TestsDescription + 0x1f;
    std::__cxx11::string::assign((char *)psVar11);
    pcVar4 = (char *)operator_new__(0x16);
    snprintf(pcVar4,0x16,"%ld",maxLength);
    std::__cxx11::string::append((char *)psVar11);
    std::__cxx11::string::append((char *)psVar11);
    operator_delete__(pcVar4);
  }
  kwssys::RegularExpression::RegularExpression(&regex,regEx);
  sVar5 = FindFunction(this,0,(char *)0x0);
  psVar11 = &this->m_BufferNoComment;
  bVar3 = 0;
  do {
    if (sVar5 == 0xffffffffffffffff) {
      kwssys::RegularExpression::~RegularExpression(&regex);
      return (bool)(~bVar3 & 1);
    }
    std::__cxx11::string::string((string *)&functionName,"",(allocator *)&error);
    sVar10 = (long)sVar5 >> 0x3f & sVar5;
    for (; 0 < (long)sVar5; sVar5 = sVar5 - 1) {
      if ((psVar11->_M_dataplus)._M_p[sVar5] == ')') {
        sVar10 = FindOpeningChar(this,')','(',sVar5,true);
        sVar10 = sVar10 - 1;
        break;
      }
    }
    bVar2 = false;
    for (; 0 < (long)sVar10; sVar10 = sVar10 - 1) {
      __lhs = (psVar11->_M_dataplus)._M_p[sVar10];
      if (((ulong)__lhs < 0x2b) && ((0x44100002600U >> ((ulong)__lhs & 0x3f) & 1) != 0)) {
        if (bVar2) break;
        bVar2 = false;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       __lhs,&functionName);
        std::__cxx11::string::operator=((string *)&functionName,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        bVar2 = true;
      }
    }
    lVar6 = GetLineNumber(this,sVar10,true);
    GetLine_abi_cxx11_(&functionLine,this,lVar6 - 1);
    lVar6 = std::__cxx11::string::find((char *)&functionLine,0x1622aa);
    if ((((((lVar6 == -1) &&
           (lVar6 = std::__cxx11::string::find((char *)&functionLine,0x162e4e), lVar6 == -1)) &&
          (lVar6 = std::__cxx11::string::find((char *)&functionLine,0x162e5a), lVar6 == -1)) &&
         (((lVar6 = std::__cxx11::string::find((char *)&functionLine,0x162e64), lVar6 == -1 &&
           (lVar6 = std::__cxx11::string::find((char *)&functionName,0x155511), lVar6 == -1)) &&
          ((lVar6 = std::__cxx11::string::find((char *)&functionName,0x162f81), lVar6 == -1 &&
           ((lVar6 = std::__cxx11::string::find((char *)&functionName,0x162f87), lVar6 == -1 &&
            (lVar6 = std::__cxx11::string::find((char *)&functionName,0x162528), lVar6 == -1))))))))
        && (lVar6 = std::__cxx11::string::find((char *)&functionName,0x162523), lVar6 == -1)) &&
       (lVar6 = std::__cxx11::string::find((char *)&functionName,0x162e17), lVar6 == -1)) {
      lVar6 = std::__cxx11::string::find((char *)&functionName,0x162e42);
      lVar9 = std::__cxx11::string::find((char *)&functionName,0x161d52);
      if (((lVar6 == -1) || (lVar9 == -1)) || (lVar9 <= lVar6)) {
        if (lVar6 == -1) goto LAB_00149240;
        std::__cxx11::string::substr((ulong)&error,(ulong)&functionName);
      }
      else {
        std::__cxx11::string::substr((ulong)&error,(ulong)&functionName);
      }
      std::__cxx11::string::operator=((string *)&functionName,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
    }
    else {
      std::__cxx11::string::assign((char *)&functionName);
    }
LAB_00149240:
    sVar1 = functionName._M_string_length;
    sVar5 = std::__cxx11::string::find((char)psVar11,0x7b);
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)&local_280,"",(allocator *)&error);
      sVar5 = FindClosingChar(this,'{','}',sVar5,true,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      sVar5 = FindFunction(this,sVar5 + 1,(char *)0x0);
    }
    else {
      sVar10 = GetPositionWithComments(this,sVar5);
      uVar7 = GetLineNumber(this,sVar10,false);
      std::__cxx11::string::string((string *)&local_2a0,"",(allocator *)&error);
      sVar10 = FindClosingChar(this,'{','}',sVar5,true,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      sVar5 = GetPositionWithComments(this,sVar10);
      uVar8 = GetLineNumber(this,sVar5,false);
      sVar5 = FindFunction(this,sVar10 + 1,(char *)0x0);
      if ((long)sVar5 < (long)sVar10) {
        sVar5 = std::__cxx11::string::find((char)psVar11,0x7b);
        sVar5 = FindFunction(this,sVar5,(char *)0x0);
      }
      bVar2 = kwssys::RegularExpression::find(&regex,functionName._M_dataplus._M_p);
      if (!bVar2) {
        error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
        error.description._M_string_length = 0;
        error.description.field_2._M_local_buf[0] = '\0';
        error.number = 0x1e;
        error.line = uVar7;
        error.line2 = uVar7;
        std::operator+(&local_2e0,"function (",&functionName);
        std::operator+(&local_300,&local_2e0,") doesn\'t match regular expression: ");
        std::operator+(&local_2c0,&local_300,regEx);
        std::__cxx11::string::operator=((string *)&error.description,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,&error);
        std::__cxx11::string::~string((string *)&error.description);
        bVar3 = 1;
      }
      if (((maxLength != 0) && (-1 < (long)(uVar8 | uVar7))) &&
         ((long)maxLength < (long)(uVar8 - uVar7))) {
        error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
        error.description._M_string_length = 0;
        error.description.field_2._M_local_buf[0] = '\0';
        error.number = 0x1f;
        error.line = uVar7;
        error.line2 = uVar8;
        std::operator+(&local_300,"function (",&functionName);
        std::operator+(&local_2c0,&local_300,") has too many lines: ");
        this_00 = &error.description;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_300);
        pcVar4 = (char *)operator_new__(0x16);
        snprintf(pcVar4,0x16,"%ld",uVar8 - uVar7);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::append((char *)this_00);
        snprintf(pcVar4,0x16,"%ld",maxLength);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::append((char *)this_00);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,&error);
        operator_delete__(pcVar4);
        std::__cxx11::string::~string((string *)this_00);
        bVar3 = 1;
      }
    }
    std::__cxx11::string::~string((string *)&functionLine);
    std::__cxx11::string::~string((string *)&functionName);
  } while( true );
}

Assistant:

bool Parser::CheckFunctions(const char* regEx,unsigned long maxLength)
{
  if(regEx)
    {
    m_TestsDone[FUNCTION_REGEX] = true;
    m_TestsDescription[FUNCTION_REGEX] = "Functions should match regular expression: ";
    m_TestsDescription[FUNCTION_REGEX] += regEx;
    }

  if(maxLength>0)
    {
    m_TestsDone[FUNCTION_LENGTH] = true;
    m_TestsDescription[FUNCTION_LENGTH] = "Functions must not exceed: ";
    constexpr size_t length = 22;
    char* temp = new char[length];
    snprintf(temp,length,"%ld",maxLength);
    m_TestsDescription[FUNCTION_LENGTH] += temp;
    m_TestsDescription[FUNCTION_LENGTH] += " lines";
    delete [] temp;
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // List all the function in the file
  auto pos = static_cast<long int>(this->FindFunction(0));
  while(pos != -1)
    {
    // We extract the name of the function
    std::string functionName = "";
    // Find the ) and the openning (
    long int i=pos;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] == ')')
        {
        i = static_cast<long int>(this->FindOpeningChar(')','(',i,true));
        i--;
        break;
        }
      }

    bool inWord = false;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\t'
         && m_BufferNoComment[i] != '\r' && m_BufferNoComment[i] != '\n'
         && m_BufferNoComment[i] != '*' && m_BufferNoComment[i] != '&')
        {
        inWord = true;
        functionName = m_BufferNoComment[i]+functionName;
        }
      else if(inWord)
        {
        break;
        }
      }

    // Check that this is not a #define (tricky)
    std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

    if(functionLine.find("#define") == std::string::npos
       && functionLine.find("_attribute_") == std::string::npos
       && functionLine.find(" operator") == std::string::npos
       && functionLine.find("friend ") == std::string::npos
       && functionName.find("if") == std::string::npos
       && functionName.find("while") == std::string::npos
       && functionName.find("for") == std::string::npos
       && functionName.find("switch") == std::string::npos
       && functionName.find("main") == std::string::npos
       && functionName.find("~") == std::string::npos // skip destructor for now...
       )
      {
      auto posf = static_cast<long int>(functionName.find("::", 0));
      auto posp = static_cast<long int>(functionName.find("(", posf));
      if(posp != -1 && posf != -1 && posp>posf)
        {
        functionName = functionName.substr(posf+2,posp-posf-2);
        }
      else if(posf != -1)
        {
        functionName = functionName.substr(posf+2,functionName.size()-posf-2);
        }
      }
    else
      {
      functionName = "";
      }

    //std::cout << "Function Name = " << functionName.c_str() << std::endl;

      if (functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        /*if(pos2 > pos)
          {
          long int bf = m_BufferNoComment.find('{',pos2);
          pos = this->FindFunction(bf);
          }*/
        continue;
      } else if (!functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        auto bfcomments = static_cast<long int>(GetPositionWithComments(bf));
        auto bfl = static_cast<long int>(this->GetLineNumber(bfcomments));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        auto poscomments = static_cast<long int>(GetPositionWithComments(pos2));
        long int efl = this->GetLineNumber(poscomments);

        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        if (pos2 > pos) {
          auto localbf =
              static_cast<long int>(m_BufferNoComment.find('{', pos2));
          pos = static_cast<long int>(this->FindFunction(localbf));
        }

      if(!regex.find(functionName))
        {
        Error error;
        error.line = bfl;
        error.line2 = error.line;
        error.number = FUNCTION_REGEX;
        error.description = "function (" + functionName + ") doesn't match regular expression: " + regEx;
        m_ErrorList.push_back(error);
        hasError = true;
        }

      if(maxLength>0)
        {
        if((bfl>-1) && (efl>-1) && (efl-bfl>(long int)maxLength))
          {
          Error error;
          error.line = bfl;
          error.line2 = efl;
          error.number = FUNCTION_LENGTH;
          error.description = "function (" + functionName + ") has too many lines: ";
          constexpr size_t length = 22;
          char* temp = new char[length];
          snprintf(temp,length,"%ld",efl-bfl);
          error.description += temp;
          error.description += " (";
          snprintf(temp,length,"%ld",maxLength);
          error.description += temp;
          error.description += ")";
          m_ErrorList.push_back(error);
          hasError = true;
          delete [] temp;
          }
        }
      }
    }

  return !hasError;
}